

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyTable.c
# Opt level: O3

void Ivy_TableUpdate(Ivy_Man_t *p,Ivy_Obj_t *pObj,int ObjIdNew)

{
  int *piVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                  ,0xa8,"void Ivy_TableUpdate(Ivy_Man_t *, Ivy_Obj_t *, int)");
  }
  if (0xfffffffc < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
    piVar1 = Ivy_TableFind(p,pObj);
    if (*piVar1 != pObj->Id) {
      __assert_fail("*pPlace == pObj->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/ivy/ivyTable.c"
                    ,0xac,"void Ivy_TableUpdate(Ivy_Man_t *, Ivy_Obj_t *, int)");
    }
    *piVar1 = ObjIdNew;
  }
  return;
}

Assistant:

void Ivy_TableUpdate( Ivy_Man_t * p, Ivy_Obj_t * pObj, int ObjIdNew )
{
    int * pPlace;
    assert( !Ivy_IsComplement(pObj) );
    if ( !Ivy_ObjIsHash(pObj) )
        return;
    pPlace = Ivy_TableFind( p, pObj );
    assert( *pPlace == pObj->Id ); // node should be in the table
    *pPlace = ObjIdNew; 
}